

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

Pass * wasm::createStubUnsupportedJSOpsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x130);
  memset(this,0,0x130);
  StubUnsupportedJSOpsPass::StubUnsupportedJSOpsPass((StubUnsupportedJSOpsPass *)this);
  return this;
}

Assistant:

Pass* createStubUnsupportedJSOpsPass() {
  return new StubUnsupportedJSOpsPass();
}